

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_ori_mipsel
               (TCGContext_conflict4 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,int64_t c,
               uint32_t oprsz,uint32_t maxsz)

{
  uint64_t val;
  TCGv_i64 c_00;
  uintptr_t o;
  
  val = dup_const_func_mipsel(vece,c);
  c_00 = tcg_const_i64_mipsel(tcg_ctx,val);
  tcg_gen_gvec_2s_mipsel(tcg_ctx,dofs,aofs,oprsz,maxsz,c_00,&gop_ors);
  tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(c_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_ori(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      int64_t c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_const_i64(tcg_ctx, dup_const(vece, c));
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_ors);
    tcg_temp_free_i64(tcg_ctx, tmp);
}